

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

PathDependentInfoToRestore __thiscall
GlobOpt::UpdatePathDependentInfo(GlobOpt *this,PathDependentInfo *info)

{
  code *pcVar1;
  bool bVar2;
  PathDependentRelationship PVar3;
  int32 lowerBound;
  int32 upperBound;
  undefined4 *puVar4;
  Value *pVVar5;
  Value *pVVar6;
  ValueInfo *pVVar7;
  ValueInfo *this_00;
  ValueInfo *this_01;
  PathDependentInfoToRestore PVar8;
  code *local_50;
  code *local_48;
  IntConstantBounds local_40;
  IntConstantBounds leftConstantBounds;
  
  if (info == (PathDependentInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x28b9,"(info)","info");
    if (!bVar2) goto LAB_00462e79;
    *puVar4 = 0;
  }
  if (info->leftValue == (Value *)0x0) {
    this_01 = (ValueInfo *)0x0;
  }
  else {
    PVar3 = PathDependentInfo::Relationship(info);
    if (PVar3 < (LessThanOrEqual|GreaterThanOrEqual)) {
      local_48 = (code *)(&PTR_UpdateIntBoundsForEqual_014d5450)[PVar3];
      local_50 = (code *)(&PTR_UpdateIntBoundsForEqual_014d5480)[PVar3];
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x28e2,"(false)","false");
      if (!bVar2) goto LAB_00462e79;
      *puVar4 = 0;
    }
    pVVar5 = PathDependentInfo::LeftValue(info);
    this_01 = pVVar5->valueInfo;
    local_40.lowerBound = 0;
    local_40.upperBound = 0;
    bVar2 = ValueInfo::TryGetIntConstantBounds(this_01,&local_40,true);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x28e8,
                         "(leftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true))",
                         "leftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true)");
      if (!bVar2) goto LAB_00462e79;
      *puVar4 = 0;
    }
    leftConstantBounds.lowerBound = 0;
    leftConstantBounds.upperBound = 0;
    pVVar5 = PathDependentInfo::RightValue(info);
    if (pVVar5 == (Value *)0x0) {
      lowerBound = PathDependentInfo::RightConstantValue(info);
      upperBound = PathDependentInfo::RightConstantValue(info);
      IntConstantBounds::IntConstantBounds(&leftConstantBounds,lowerBound,upperBound);
      this_00 = (ValueInfo *)0x0;
    }
    else {
      pVVar5 = PathDependentInfo::RightValue(info);
      this_00 = pVVar5->valueInfo;
      bVar2 = ValueInfo::TryGetIntConstantBounds(this_00,&leftConstantBounds,true);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x28ef,
                           "(rightValueInfo->TryGetIntConstantBounds(&rightConstantBounds, true))",
                           "rightValueInfo->TryGetIntConstantBounds(&rightConstantBounds, true)");
        if (!bVar2) goto LAB_00462e79;
        *puVar4 = 0;
      }
    }
    pVVar5 = PathDependentInfo::LeftValue(info);
    pVVar6 = PathDependentInfo::RightValue(info);
    pVVar7 = (ValueInfo *)(*local_50)(this,pVVar5,&local_40,pVVar6);
    if (pVVar7 == (ValueInfo *)0x0) {
      this_01 = (ValueInfo *)0x0;
    }
    else {
      pVVar5 = PathDependentInfo::LeftValue(info);
      ChangeValueInfo(this,(BasicBlock *)0x0,pVVar5,pVVar7,false,false);
      bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar7,&local_40,true);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2901,
                           "(newLeftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true))",
                           "newLeftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true)");
        if (!bVar2) {
LAB_00462e79:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    pVVar5 = PathDependentInfo::RightValue(info);
    pVVar6 = PathDependentInfo::LeftValue(info);
    pVVar7 = (ValueInfo *)(*local_48)(this,pVVar5,&leftConstantBounds,pVVar6);
    if (pVVar7 != (ValueInfo *)0x0) {
      pVVar5 = PathDependentInfo::RightValue(info);
      ChangeValueInfo(this,(BasicBlock *)0x0,pVVar5,pVVar7,false,false);
      goto LAB_00462e64;
    }
  }
  this_00 = (ValueInfo *)0x0;
LAB_00462e64:
  PVar8.rightValueInfo = this_00;
  PVar8.leftValueInfo = this_01;
  return PVar8;
}

Assistant:

PathDependentInfoToRestore
GlobOpt::UpdatePathDependentInfo(PathDependentInfo *const info)
{
    Assert(info);

    if(!info->HasInfo())
    {
        return PathDependentInfoToRestore();
    }

    decltype(&GlobOpt::UpdateIntBoundsForEqual) UpdateIntBoundsForLeftValue, UpdateIntBoundsForRightValue;
    switch(info->Relationship())
    {
        case PathDependentRelationship::Equal:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForEqual;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForEqual;
            break;

        case PathDependentRelationship::NotEqual:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForNotEqual;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForNotEqual;
            break;

        case PathDependentRelationship::GreaterThanOrEqual:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForGreaterThanOrEqual;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForLessThanOrEqual;
            break;

        case PathDependentRelationship::GreaterThan:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForGreaterThan;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForLessThan;
            break;

        case PathDependentRelationship::LessThanOrEqual:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForLessThanOrEqual;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForGreaterThanOrEqual;
            break;

        case PathDependentRelationship::LessThan:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForLessThan;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForGreaterThan;
            break;

        default:
            Assert(false);
            __assume(false);
    }

    ValueInfo *leftValueInfo = info->LeftValue()->GetValueInfo();
    IntConstantBounds leftConstantBounds;
    AssertVerify(leftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true));

    ValueInfo *rightValueInfo;
    IntConstantBounds rightConstantBounds;
    if(info->RightValue())
    {
        rightValueInfo = info->RightValue()->GetValueInfo();
        AssertVerify(rightValueInfo->TryGetIntConstantBounds(&rightConstantBounds, true));
    }
    else
    {
        rightValueInfo = nullptr;
        rightConstantBounds = IntConstantBounds(info->RightConstantValue(), info->RightConstantValue());
    }

    ValueInfo *const newLeftValueInfo =
        (this->*UpdateIntBoundsForLeftValue)(
            info->LeftValue(),
            leftConstantBounds,
            info->RightValue(),
            rightConstantBounds,
            true);
    if(newLeftValueInfo)
    {
        ChangeValueInfo(nullptr, info->LeftValue(), newLeftValueInfo);
        AssertVerify(newLeftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true));
    }
    else
    {
        leftValueInfo = nullptr;
    }

    ValueInfo *const newRightValueInfo =
        (this->*UpdateIntBoundsForRightValue)(
            info->RightValue(),
            rightConstantBounds,
            info->LeftValue(),
            leftConstantBounds,
            true);
    if(newRightValueInfo)
    {
        ChangeValueInfo(nullptr, info->RightValue(), newRightValueInfo);
    }
    else
    {
        rightValueInfo = nullptr;
    }

    return PathDependentInfoToRestore(leftValueInfo, rightValueInfo);
}